

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::drawScaleHandles(XFormWidget *this)

{
  double *pdVar1;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  Vector3D c;
  double local_178;
  double dStack_170;
  double local_168;
  undefined1 local_158 [16];
  double local_148;
  double dStack_140;
  double local_138;
  double local_128;
  double dStack_120;
  double local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    local_128 = (this->center).x;
    dStack_120 = (this->center).y;
    local_118 = (this->center).z;
    dVar3 = (this->bounds).max.x - (this->bounds).min.x;
    dVar9 = (this->bounds).max.y - (this->bounds).min.y;
    dVar10 = (this->bounds).max.z - (this->bounds).min.z;
    dVar3 = SQRT(dVar10 * dVar10 + dVar3 * dVar3 + dVar9 * dVar9) * 0.5;
    glLineWidth(0x41000000);
    glBegin(1);
    dVar9 = dVar3 * 0.9;
    local_158._8_4_ = SUB84(dVar9,0);
    local_158._0_8_ = dVar9;
    local_158._12_4_ = (int)((ulong)dVar9 >> 0x20);
    for (lVar8 = 0; lVar8 != 0x48; lVar8 = lVar8 + 0x18) {
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_168 = *(double *)((long)&pVVar2->z + lVar8) * dVar9 + local_118;
      pdVar1 = (double *)((long)&pVVar2->x + lVar8);
      local_178 = *pdVar1 * (double)local_158._0_8_ + local_128;
      dStack_170 = pdVar1[1] * (double)local_158._8_8_ + dStack_120;
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar8));
      glVertex3dv(&local_128);
      glVertex3dv(&local_178);
    }
    glEnd();
    glBegin(7);
    local_78 = dVar3 * 0.8;
    dVar3 = dVar3 * 0.5 * 0.2;
    local_158._8_8_ = 0;
    local_158._0_8_ = local_78;
    local_88._8_4_ = SUB84(dVar3,0);
    local_88._0_8_ = dVar3;
    local_88._12_4_ = (int)((ulong)dVar3 >> 0x20);
    dStack_70 = local_78;
    for (lVar8 = 0; lVar8 != 0x48; lVar8 = lVar8 + 0x18) {
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar8));
      pVVar2 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_f8 = *(double *)((long)&pVVar2->z + lVar8) * (double)local_158._0_8_ + local_118;
      pdVar1 = (double *)((long)&pVVar2->x + lVar8);
      local_108 = *pdVar1 * local_78 + local_128;
      dStack_100 = pdVar1[1] * dStack_70 + dStack_120;
      dVar4 = pVVar2[1].x;
      dVar5 = pVVar2[1].y;
      dVar9 = pVVar2[1].z;
      dVar6 = pVVar2[2].x;
      dVar7 = pVVar2[2].y;
      dVar10 = pVVar2[2].z;
      local_178 = ((pVVar2->x - dVar4) - dVar6) * (double)local_88._0_8_ + local_108;
      dStack_170 = ((pVVar2->y - dVar5) - dVar7) * (double)local_88._8_8_ + dStack_100;
      local_168 = ((pVVar2->z - dVar9) - dVar10) * dVar3 + local_f8;
      local_98 = ((pVVar2->z - dVar9) + dVar10) * dVar3 + local_f8;
      local_a8 = ((pVVar2->x - dVar4) + dVar6) * (double)local_88._0_8_ + local_108;
      dStack_a0 = ((pVVar2->y - dVar5) + dVar7) * (double)local_88._8_8_ + dStack_100;
      local_b8 = ((pVVar2->z + dVar9) - dVar10) * dVar3 + local_f8;
      local_c8 = ((pVVar2->x + dVar4) - dVar6) * (double)local_88._0_8_ + local_108;
      dStack_c0 = ((pVVar2->y + dVar5) - dVar7) * (double)local_88._8_8_ + dStack_100;
      local_138 = (pVVar2->z + dVar9 + dVar10) * dVar3 + local_f8;
      local_148 = (pVVar2->x + dVar4 + dVar6) * (double)local_88._0_8_ + local_108;
      dStack_140 = (pVVar2->y + dVar5 + dVar7) * (double)local_88._8_8_ + dStack_100;
      local_38 = ((-pVVar2->z - dVar9) - dVar10) * dVar3 + local_f8;
      local_48 = ((-pVVar2->x - dVar4) - dVar6) * (double)local_88._0_8_ + local_108;
      dStack_40 = ((-pVVar2->y - dVar5) - dVar7) * (double)local_88._8_8_ + dStack_100;
      local_58 = ((-pVVar2->z - dVar9) + dVar10) * dVar3 + local_f8;
      local_68 = ((-pVVar2->x - dVar4) + dVar6) * (double)local_88._0_8_ + local_108;
      dStack_60 = ((-pVVar2->y - dVar5) + dVar7) * (double)local_88._8_8_ + dStack_100;
      local_d8 = ((dVar9 - pVVar2->z) - dVar10) * dVar3 + local_f8;
      local_e8 = ((dVar4 - pVVar2->x) - dVar6) * (double)local_88._0_8_ + local_108;
      dStack_e0 = ((dVar5 - pVVar2->y) - dVar7) * (double)local_88._8_8_ + dStack_100;
      local_f8 = ((dVar9 - pVVar2->z) + dVar10) * dVar3 + local_f8;
      local_108 = ((dVar4 - pVVar2->x) + dVar6) * (double)local_88._0_8_ + local_108;
      dStack_100 = ((dVar5 - pVVar2->y) + dVar7) * (double)local_88._8_8_ + dStack_100;
      glVertex3dv(&local_178);
      glVertex3dv(&local_a8);
      glVertex3dv(&local_148);
      glVertex3dv(&local_c8);
      glVertex3dv(&local_48);
      glVertex3dv(&local_68);
      glVertex3dv(&local_108);
      glVertex3dv(&local_e8);
      glVertex3dv(&local_178);
      glVertex3dv(&local_c8);
      glVertex3dv(&local_e8);
      glVertex3dv(&local_48);
      glVertex3dv(&local_a8);
      glVertex3dv(&local_148);
      glVertex3dv(&local_108);
      glVertex3dv(&local_68);
      glVertex3dv(&local_178);
      glVertex3dv(&local_48);
      glVertex3dv(&local_68);
      glVertex3dv(&local_a8);
      glVertex3dv(&local_c8);
      glVertex3dv(&local_e8);
      glVertex3dv(&local_108);
      glVertex3dv(&local_148);
    }
    glEnd();
    drawCenterHandle(this);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawScaleHandles() const {
  const double boxSize = .2;

  if (target.object == nullptr) return;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  // Draw arrow stems
  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = 0; i < 3; i++) {
    Vector3D b = c + (1. - boxSize / 2.) * r * axes[i];

    glColor4ubv(&axisColors[i][0]);

    glVertex3dv(&c.x);
    glVertex3dv(&b.x);
  }
  glEnd();

  // Draw box heads
  glBegin(GL_QUADS);
  for (int i = 0; i < 3; i++) {
    glColor4ubv(&axisColors[i][0]);
    Vector3D q = c + r * (1. - boxSize) * axes[i];
    Vector3D q000 = q + .5 * r * boxSize * (axes[0] - axes[1] - axes[2]);
    Vector3D q001 = q + .5 * r * boxSize * (axes[0] - axes[1] + axes[2]);
    Vector3D q010 = q + .5 * r * boxSize * (axes[0] + axes[1] - axes[2]);
    Vector3D q011 = q + .5 * r * boxSize * (axes[0] + axes[1] + axes[2]);
    Vector3D q100 = q + .5 * r * boxSize * (-axes[0] - axes[1] - axes[2]);
    Vector3D q101 = q + .5 * r * boxSize * (-axes[0] - axes[1] + axes[2]);
    Vector3D q110 = q + .5 * r * boxSize * (-axes[0] + axes[1] - axes[2]);
    Vector3D q111 = q + .5 * r * boxSize * (-axes[0] + axes[1] + axes[2]);

    glVertex3dv(&q000.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q011.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q000.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q011.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q000.x);
    glVertex3dv(&q100.x);
    glVertex3dv(&q101.x);
    glVertex3dv(&q001.x);
    glVertex3dv(&q010.x);
    glVertex3dv(&q110.x);
    glVertex3dv(&q111.x);
    glVertex3dv(&q011.x);
  }
  glEnd();

  drawCenterHandle();

  glLineWidth(1.);
}